

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ushort uVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  short sVar6;
  short sVar7;
  bool bVar8;
  short sVar9;
  bool bVar10;
  short sVar11;
  bool bVar12;
  short sVar13;
  unkbyte10 Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar18;
  int iVar19;
  uint uVar20;
  parasail_result_t *ppVar21;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  undefined8 unaff_RBX;
  uint uVar29;
  int iVar30;
  short sVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  int16_t iVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  undefined4 uVar44;
  undefined1 auVar46 [16];
  undefined4 uVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar65;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar66 [16];
  ushort uVar75;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_XMM15 [16];
  short local_1e8;
  short sStack_1e6;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  undefined1 local_188 [16];
  short local_178;
  short sStack_176;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  long local_118;
  int *local_110;
  ulong local_108;
  ulong local_100;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar43;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar76;
  short sVar78;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar41 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse41_128_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse41_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse41_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar19 = _s1Len + 7;
  uVar42 = s2Len + 7;
  iVar36 = -open;
  iVar24 = matrix->min;
  iVar30 = -iVar24;
  if (iVar24 != iVar36 && SBORROW4(iVar24,iVar36) == iVar24 + open < 0) {
    iVar30 = open;
  }
  uVar34 = iVar30 - 0x7fff;
  iVar24 = matrix->max;
  auVar46 = pshuflw(ZEXT416(uVar34),ZEXT416(uVar34),0);
  uVar44 = auVar46._0_4_;
  local_1e8 = auVar46._0_2_;
  sStack_1e6 = auVar46._2_2_;
  local_d8 = 0;
  local_188 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar46 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_d8 = auVar46._0_4_;
  }
  local_128._0_8_ = CONCAT26(sStack_1e6,CONCAT24(local_1e8,uVar44));
  local_128._8_8_ = CONCAT26(sStack_1e6,CONCAT24(local_1e8,uVar44));
  local_138._8_8_ = local_128._8_8_;
  local_138._0_8_ = local_128._0_8_;
  local_b8._8_8_ = local_128._8_8_;
  local_b8._0_8_ = local_128._0_8_;
  local_148._8_8_ = local_128._8_8_;
  local_148._0_8_ = local_128._0_8_;
  local_c8._8_8_ = local_128._8_8_;
  local_c8._0_8_ = local_128._0_8_;
  uVar1 = (ushort)iVar36;
  sVar18 = (short)gap;
  if (s1_beg == 0) {
    local_188._8_8_ =
         (ulong)(uint)(gap * 0xfffd - open) & 0xffff | (ulong)(ushort)(uVar1 + sVar18 * -2) << 0x10
         | (ulong)(ushort)(uVar1 - sVar18) << 0x20 | (ulong)uVar1 << 0x30;
    local_188._0_8_ =
         (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
         (ulong)(ushort)(sVar18 * -6 - (short)open) << 0x10 |
         (ulong)(ushort)(sVar18 * -5 - (short)open) << 0x20 |
         (ulong)(ushort)(uVar1 + sVar18 * -4) << 0x30;
  }
  uStack_d4 = local_d8;
  uStack_d0 = local_d8;
  uStack_cc = local_d8;
  ppVar21 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar21 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar21->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x8221002;
  uVar27 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar27);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar27);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar27);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar19);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar2 = matrix->mapper;
      uVar27 = 0;
      do {
        ptr_02[uVar27] = (int16_t)piVar2[(byte)_s1[uVar27]];
        uVar27 = uVar27 + 1;
      } while ((uint)_s1Len != uVar27);
    }
    iVar30 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar19) {
      iVar30 = iVar19;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar30) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  auVar46 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar24));
  auVar46 = pshuflw(auVar46,auVar46,0);
  auVar58 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
  auVar63 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  uVar45 = auVar46._0_4_;
  auVar59._0_8_ = CONCAT44(uVar45,uVar45);
  auVar59._8_4_ = uVar45;
  auVar59._12_4_ = uVar45;
  auVar47 = pshuflw(auVar59,ZEXT416((uint)open),0);
  auVar66 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)gap),0);
  local_48._0_4_ = auVar58._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar58._8_4_ = 0xffffffff;
  auVar58._0_8_ = 0xffffffffffffffff;
  auVar58._12_4_ = 0xffffffff;
  local_68._0_4_ = auVar63._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  local_78 = auVar47._0_4_;
  local_88 = auVar66._0_4_;
  local_98 = paddsw(local_48,auVar58);
  local_58 = paddsw(auVar58,local_68);
  piVar2 = matrix->mapper;
  uVar27 = 0;
  do {
    ptr[uVar27 + 7] = (int16_t)piVar2[(byte)_s2[uVar27]];
    uVar27 = uVar27 + 1;
  } while (uVar41 != uVar27);
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  uVar25 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar42) {
    uVar25 = uVar42;
  }
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  memset(ptr + uVar41 + 7,0,(ulong)(~s2Len + uVar25) * 2 + 2);
  uVar27 = 0;
  iVar39 = (int16_t)uVar34;
  iVar24 = iVar36;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar27 + 7] = (int16_t)iVar24;
      ptr_01[uVar27 + 7] = iVar39;
      uVar27 = uVar27 + 1;
      iVar24 = iVar24 - gap;
    } while (uVar41 != uVar27);
  }
  else {
    do {
      ptr_00[uVar27 + 7] = 0;
      ptr_01[uVar27 + 7] = iVar39;
      uVar27 = uVar27 + 1;
    } while (uVar41 != uVar27);
  }
  lVar22 = 0;
  do {
    ptr_00[lVar22] = iVar39;
    ptr_01[lVar22] = iVar39;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 7);
  lVar22 = uVar41 + 7;
  uVar27 = uVar41;
  do {
    ptr_00[lVar22] = iVar39;
    ptr_01[lVar22] = iVar39;
    lVar22 = lVar22 + 1;
    uVar25 = (int)uVar27 + 1;
    uVar27 = (ulong)uVar25;
  } while ((int)uVar25 < (int)uVar42);
  ptr_00[6] = 0;
  local_178 = auVar46._0_2_;
  sStack_176 = auVar46._2_2_;
  if (_s1Len < 1) {
    local_158._4_2_ = local_1e8;
    local_158._0_4_ = uVar44;
    local_158._6_2_ = sStack_1e6;
    local_158._8_2_ = local_1e8;
    local_158._10_2_ = sStack_1e6;
    local_158._12_2_ = local_1e8;
    local_158._14_2_ = sStack_1e6;
    local_c8 = local_158;
    local_148 = local_158;
    local_b8 = local_158;
    local_168._0_2_ = local_178;
    local_168._2_2_ = sStack_176;
    local_168._4_2_ = local_178;
    local_168._6_2_ = sStack_176;
    uStack_160._0_2_ = local_178;
    uStack_160._2_2_ = sStack_176;
    uStack_160._4_2_ = local_178;
    uStack_160._6_2_ = sStack_176;
  }
  else {
    local_110 = matrix->matrix;
    uVar25 = _s1Len - 1;
    Var14 = CONCAT28(local_1e8,CONCAT26(sStack_1e6,CONCAT24(local_1e8,uVar44)));
    auVar46._10_2_ = sStack_1e6;
    auVar46._0_10_ = Var14;
    auVar46._12_2_ = local_1e8;
    auVar46._14_2_ = sStack_1e6;
    local_100 = 1;
    if (1 < (int)uVar42) {
      local_100 = (ulong)uVar42;
    }
    local_a8 = auVar46 >> 0x10;
    auVar47 = local_a8;
    uVar32 = (ulong)(uint)_s1Len;
    local_190 = uVar41 * 0x1c + -0x1c;
    local_118 = uVar41 * 0x20;
    local_198 = uVar41 * 4 + -4;
    local_1a8 = uVar41 * 0x18 + -0x18;
    local_1b0 = uVar41 * 0x14 + -0x14;
    local_1b8 = uVar41 * 8 + -8;
    local_1c0 = uVar41 * 0x10 + -0x10;
    local_1c8 = uVar41 * 0xc + -0xc;
    auVar58 = pmovsxbw(in_XMM10,0x1020304050607);
    local_1a0 = 0;
    uStack_170 = auVar59._8_8_;
    uStack_160 = uStack_170;
    uVar27 = 0;
    local_c8 = auVar46;
    local_148 = auVar46;
    local_b8 = auVar46;
    local_168 = auVar59._0_8_;
    local_158 = auVar46;
    do {
      uVar42 = (uint)uVar27;
      if (matrix->type == 0) {
        uVar20 = (uint)ptr_02[uVar27 + 1];
        uVar26 = (uint)ptr_02[uVar27 + 2];
        uVar33 = (uint)ptr_02[uVar27 + 3];
        uVar28 = (uint)ptr_02[uVar27 + 4];
        uVar37 = (uint)ptr_02[uVar27 + 5];
        uVar35 = (uint)ptr_02[uVar27 + 6];
        uVar29 = (int)ptr_02[uVar27];
        uVar40 = (int)ptr_02[uVar27 + 7];
      }
      else {
        uVar20 = uVar42 | 1;
        if (uVar32 <= (uVar27 | 1)) {
          uVar20 = uVar25;
        }
        uVar26 = uVar42 | 2;
        if (uVar32 <= (uVar27 | 2)) {
          uVar26 = uVar25;
        }
        uVar33 = uVar42 | 3;
        if (uVar32 <= (uVar27 | 3)) {
          uVar33 = uVar25;
        }
        uVar28 = uVar42 | 4;
        if (uVar32 <= (uVar27 | 4)) {
          uVar28 = uVar25;
        }
        uVar37 = uVar42 | 5;
        if (uVar32 <= (uVar27 | 5)) {
          uVar37 = uVar25;
        }
        uVar35 = uVar42 | 6;
        if (uVar32 <= (uVar27 | 6)) {
          uVar35 = uVar25;
        }
        uVar29 = uVar42;
        uVar40 = uVar42 | 7;
        if (uVar32 <= (uVar27 | 7)) {
          uVar40 = uVar25;
        }
      }
      iVar24 = matrix->size;
      local_108 = uVar27 + 8;
      local_e0 = local_110 + (int)(uVar26 * iVar24);
      local_e8 = local_110 + (int)(uVar28 * iVar24);
      local_f0 = local_110 + (int)(uVar35 * iVar24);
      local_a8._0_8_ = (undefined8)((unkuint10)Var14 >> 0x10);
      local_a8._8_8_ = auVar46._8_8_ >> 0x10;
      auVar63._8_8_ = local_a8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
      auVar63._0_8_ = local_a8._0_8_;
      uVar42 = iVar36 - uVar42 * gap;
      if (s1_beg != 0) {
        uVar42 = 0;
      }
      local_f8 = local_110 + (int)(uVar40 * iVar24);
      auVar82._8_8_ = local_a8._8_8_ | (ulong)uVar42 << 0x30;
      auVar82._0_8_ = local_a8._0_8_;
      ptr_00[6] = uVar1 - (short)local_108 * sVar18;
      auVar84._0_2_ = -(ushort)(local_98._0_2_ == auVar58._0_2_);
      auVar84._2_2_ = -(ushort)(local_98._2_2_ == auVar58._2_2_);
      auVar84._4_2_ = -(ushort)(local_98._4_2_ == auVar58._4_2_);
      auVar84._6_2_ = -(ushort)(local_98._6_2_ == auVar58._6_2_);
      auVar84._8_2_ = -(ushort)(local_98._8_2_ == auVar58._8_2_);
      auVar84._10_2_ = -(ushort)(local_98._10_2_ == auVar58._10_2_);
      auVar84._12_2_ = -(ushort)(local_98._12_2_ == auVar58._12_2_);
      auVar84._14_2_ = -(ushort)(local_98._14_2_ == auVar58._14_2_);
      in_XMM15 = pmovsxbw(in_XMM15,0xfffefdfcfbfaf9);
      auVar66._4_2_ = local_1e8;
      auVar66._0_4_ = uVar44;
      auVar66._6_2_ = sStack_1e6;
      auVar66._8_2_ = local_1e8;
      auVar66._10_2_ = sStack_1e6;
      auVar66._12_2_ = local_1e8;
      auVar66._14_2_ = sStack_1e6;
      uVar23 = 0;
      auVar59 = auVar66;
      do {
        auVar48._10_2_ = (short)(local_110 + (int)(uVar26 * iVar24))[ptr[uVar23 + 5]];
        auVar48._8_2_ = (short)local_110[(long)(int)(uVar33 * iVar24) + (long)ptr[uVar23 + 4]];
        auVar48._12_2_ = (short)local_110[(long)(int)(uVar20 * iVar24) + (long)ptr[uVar23 + 6]];
        auVar48._14_2_ = (short)local_110[(long)(int)(uVar29 * iVar24) + (long)ptr[uVar23 + 7]];
        auVar48._0_8_ =
             (ulong)(uint)(local_110 + (int)(uVar40 * iVar24))[ptr[uVar23]] & 0xffffffff0000ffff |
             (ulong)*(ushort *)(local_110 + (int)(uVar35 * iVar24) + ptr[uVar23 + 1]) << 0x10 |
             (ulong)*(ushort *)(local_110 + (long)(int)(uVar37 * iVar24) + (long)ptr[uVar23 + 2]) <<
             0x20 | (ulong)*(ushort *)(local_110 + (int)(uVar28 * iVar24) + ptr[uVar23 + 3]) << 0x30
        ;
        auVar83._0_8_ = auVar82._2_8_;
        auVar83._8_8_ = auVar82._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar23 + 7] << 0x30;
        auVar63 = paddsw(auVar48,auVar63);
        auVar79._0_8_ = auVar59._2_8_;
        auVar79._8_8_ = auVar59._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar23 + 7] << 0x30;
        auVar17._4_4_ = uStack_74;
        auVar17._0_4_ = local_78;
        auVar17._8_4_ = uStack_70;
        auVar17._12_4_ = uStack_6c;
        auVar59 = psubsw(auVar83,auVar17);
        auVar16._4_4_ = uStack_84;
        auVar16._0_4_ = local_88;
        auVar16._8_4_ = uStack_80;
        auVar16._12_4_ = uStack_7c;
        auVar80 = psubsw(auVar79,auVar16);
        sVar31 = auVar59._0_2_;
        sVar76 = auVar80._0_2_;
        auVar81._0_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._2_2_;
        sVar76 = auVar80._2_2_;
        auVar81._2_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._4_2_;
        sVar76 = auVar80._4_2_;
        auVar81._4_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._6_2_;
        sVar76 = auVar80._6_2_;
        auVar81._6_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._8_2_;
        sVar76 = auVar80._8_2_;
        auVar81._8_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._10_2_;
        sVar76 = auVar80._10_2_;
        auVar81._10_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._12_2_;
        sVar76 = auVar80._12_2_;
        sVar78 = auVar80._14_2_;
        auVar81._12_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar59._14_2_;
        auVar81._14_2_ = (ushort)(sVar78 < sVar31) * sVar31 | (ushort)(sVar78 >= sVar31) * sVar78;
        auVar82 = psubsw(auVar82,auVar17);
        auVar59 = psubsw(auVar66,auVar16);
        sVar31 = auVar82._0_2_;
        sVar76 = auVar59._0_2_;
        auVar77._0_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._2_2_;
        sVar76 = auVar59._2_2_;
        auVar77._2_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._4_2_;
        sVar76 = auVar59._4_2_;
        auVar77._4_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._6_2_;
        sVar76 = auVar59._6_2_;
        auVar77._6_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._8_2_;
        sVar76 = auVar59._8_2_;
        auVar77._8_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._10_2_;
        sVar76 = auVar59._10_2_;
        auVar77._10_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._12_2_;
        sVar76 = auVar59._12_2_;
        sVar78 = auVar59._14_2_;
        auVar77._12_2_ = (ushort)(sVar76 < sVar31) * sVar31 | (ushort)(sVar76 >= sVar31) * sVar76;
        sVar31 = auVar82._14_2_;
        auVar77._14_2_ = (ushort)(sVar78 < sVar31) * sVar31 | (ushort)(sVar78 >= sVar31) * sVar78;
        uVar65 = ((short)auVar77._0_2_ < (short)auVar81._0_2_) * auVar81._0_2_ |
                 ((short)auVar77._0_2_ >= (short)auVar81._0_2_) * auVar77._0_2_;
        uVar69 = ((short)auVar77._2_2_ < (short)auVar81._2_2_) * auVar81._2_2_ |
                 ((short)auVar77._2_2_ >= (short)auVar81._2_2_) * auVar77._2_2_;
        uVar70 = ((short)auVar77._4_2_ < (short)auVar81._4_2_) * auVar81._4_2_ |
                 ((short)auVar77._4_2_ >= (short)auVar81._4_2_) * auVar77._4_2_;
        uVar71 = ((short)auVar77._6_2_ < (short)auVar81._6_2_) * auVar81._6_2_ |
                 ((short)auVar77._6_2_ >= (short)auVar81._6_2_) * auVar77._6_2_;
        uVar72 = ((short)auVar77._8_2_ < (short)auVar81._8_2_) * auVar81._8_2_ |
                 ((short)auVar77._8_2_ >= (short)auVar81._8_2_) * auVar77._8_2_;
        uVar73 = ((short)auVar77._10_2_ < (short)auVar81._10_2_) * auVar81._10_2_ |
                 ((short)auVar77._10_2_ >= (short)auVar81._10_2_) * auVar77._10_2_;
        uVar74 = ((short)auVar77._12_2_ < (short)auVar81._12_2_) * auVar81._12_2_ |
                 ((short)auVar77._12_2_ >= (short)auVar81._12_2_) * auVar77._12_2_;
        uVar75 = ((short)auVar77._14_2_ < (short)auVar81._14_2_) * auVar81._14_2_ |
                 ((short)auVar77._14_2_ >= (short)auVar81._14_2_) * auVar77._14_2_;
        sVar31 = auVar63._0_2_;
        auVar67._0_2_ =
             (ushort)((short)uVar65 < sVar31) * sVar31 | ((short)uVar65 >= sVar31) * uVar65;
        sVar31 = auVar63._2_2_;
        auVar67._2_2_ =
             (ushort)((short)uVar69 < sVar31) * sVar31 | ((short)uVar69 >= sVar31) * uVar69;
        sVar31 = auVar63._4_2_;
        auVar67._4_2_ =
             (ushort)((short)uVar70 < sVar31) * sVar31 | ((short)uVar70 >= sVar31) * uVar70;
        sVar31 = auVar63._6_2_;
        auVar67._6_2_ =
             (ushort)((short)uVar71 < sVar31) * sVar31 | ((short)uVar71 >= sVar31) * uVar71;
        sVar31 = auVar63._8_2_;
        auVar67._8_2_ =
             (ushort)((short)uVar72 < sVar31) * sVar31 | ((short)uVar72 >= sVar31) * uVar72;
        sVar31 = auVar63._10_2_;
        auVar67._10_2_ =
             (ushort)((short)uVar73 < sVar31) * sVar31 | ((short)uVar73 >= sVar31) * uVar73;
        sVar31 = auVar63._12_2_;
        auVar67._12_2_ =
             (ushort)((short)uVar74 < sVar31) * sVar31 | ((short)uVar74 >= sVar31) * uVar74;
        sVar31 = auVar63._14_2_;
        auVar67._14_2_ =
             (ushort)((short)uVar75 < sVar31) * sVar31 | ((short)uVar75 >= sVar31) * uVar75;
        sVar43 = in_XMM15._0_2_;
        auVar49._0_2_ = -(ushort)(sVar43 == -1);
        sVar51 = in_XMM15._2_2_;
        auVar49._2_2_ = -(ushort)(sVar51 == -1);
        sVar52 = in_XMM15._4_2_;
        auVar49._4_2_ = -(ushort)(sVar52 == -1);
        sVar53 = in_XMM15._6_2_;
        auVar49._6_2_ = -(ushort)(sVar53 == -1);
        sVar54 = in_XMM15._8_2_;
        auVar49._8_2_ = -(ushort)(sVar54 == -1);
        sVar55 = in_XMM15._10_2_;
        auVar49._10_2_ = -(ushort)(sVar55 == -1);
        sVar56 = in_XMM15._12_2_;
        sVar57 = in_XMM15._14_2_;
        auVar49._12_2_ = -(ushort)(sVar56 == -1);
        auVar49._14_2_ = -(ushort)(sVar57 == -1);
        auVar82 = pblendvb(auVar67,local_188,auVar49);
        auVar80._4_2_ = local_1e8;
        auVar80._0_4_ = uVar44;
        auVar80._6_2_ = sStack_1e6;
        auVar80._8_2_ = local_1e8;
        auVar80._10_2_ = sStack_1e6;
        auVar80._12_2_ = local_1e8;
        auVar80._14_2_ = sStack_1e6;
        auVar59 = pblendvb(auVar81,auVar80,auVar49);
        auVar66 = pblendvb(auVar77,auVar80,auVar49);
        sVar31 = auVar82._0_2_;
        sVar76 = auVar82._2_2_;
        sVar13 = auVar82._14_2_;
        sVar7 = auVar82._8_2_;
        sVar9 = auVar82._10_2_;
        sVar11 = auVar82._12_2_;
        sVar78 = auVar82._4_2_;
        sVar6 = auVar82._6_2_;
        if (7 < uVar23) {
          bVar3 = sVar31 < (short)local_168;
          uVar65 = (ushort)!bVar3 * (short)local_168;
          bVar4 = sVar76 < local_168._2_2_;
          uVar69 = (ushort)!bVar4 * local_168._2_2_;
          bVar5 = sVar78 < local_168._4_2_;
          uVar70 = (ushort)!bVar5 * local_168._4_2_;
          bVar8 = sVar7 < (short)uStack_160;
          uVar71 = (ushort)!bVar8 * (short)uStack_160;
          bVar10 = sVar9 < uStack_160._2_2_;
          uVar72 = (ushort)!bVar10 * uStack_160._2_2_;
          bVar12 = sVar11 < uStack_160._4_2_;
          uVar73 = (ushort)!bVar12 * uStack_160._4_2_;
          local_168 = CONCAT26((ushort)(sVar6 < local_168._6_2_) * sVar6 |
                               (ushort)(sVar6 >= local_168._6_2_) * local_168._6_2_,
                               CONCAT24((ushort)bVar5 * sVar78 | uVar70,
                                        CONCAT22((ushort)bVar4 * sVar76 | uVar69,
                                                 (ushort)bVar3 * sVar31 | uVar65)));
          uStack_160 = CONCAT26((ushort)(sVar13 < uStack_160._6_2_) * sVar13 |
                                (ushort)(sVar13 >= uStack_160._6_2_) * uStack_160._6_2_,
                                CONCAT24((ushort)bVar12 * sVar11 | uVar73,
                                         CONCAT22((ushort)bVar10 * sVar9 | uVar72,
                                                  (ushort)bVar8 * sVar7 | uVar71)));
          local_158._2_2_ =
               (ushort)((short)local_158._2_2_ < sVar76) * sVar76 |
               (ushort)((short)local_158._2_2_ >= sVar76) * local_158._2_2_;
          local_158._0_2_ =
               (ushort)((short)local_158._0_2_ < sVar31) * sVar31 |
               (ushort)((short)local_158._0_2_ >= sVar31) * local_158._0_2_;
          local_158._4_2_ =
               (ushort)((short)local_158._4_2_ < sVar78) * sVar78 |
               (ushort)((short)local_158._4_2_ >= sVar78) * local_158._4_2_;
          local_158._6_2_ =
               (ushort)((short)local_158._6_2_ < sVar6) * sVar6 |
               (ushort)((short)local_158._6_2_ >= sVar6) * local_158._6_2_;
          local_158._8_2_ =
               (ushort)((short)local_158._8_2_ < sVar7) * sVar7 |
               (ushort)((short)local_158._8_2_ >= sVar7) * local_158._8_2_;
          local_158._10_2_ =
               (ushort)((short)local_158._10_2_ < sVar9) * sVar9 |
               (ushort)((short)local_158._10_2_ >= sVar9) * local_158._10_2_;
          local_158._12_2_ =
               (ushort)((short)local_158._12_2_ < sVar11) * sVar11 |
               (ushort)((short)local_158._12_2_ >= sVar11) * local_158._12_2_;
          local_158._14_2_ =
               (ushort)((short)local_158._14_2_ < sVar13) * sVar13 |
               (ushort)((short)local_158._14_2_ >= sVar13) * local_158._14_2_;
        }
        piVar2 = ((ppVar21->field_4).rowcols)->score_row;
        if (uVar23 < uVar41) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_1a0) = (int)sVar13;
        }
        if (uVar23 - 1 < uVar41 && (uVar27 | 1) < uVar32) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_198) = (int)sVar11;
        }
        if (((uVar27 | 2) < uVar32) && ((long)(uVar23 - 2) < (long)uVar41 && 1 < uVar23)) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_1b8) = (int)sVar9;
        }
        if (((uVar27 | 3) < uVar32) && ((long)(uVar23 - 3) < (long)uVar41 && 2 < uVar23)) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_1c8) = (int)sVar7;
        }
        if (((uVar27 | 4) < uVar32) && ((long)(uVar23 - 4) < (long)uVar41 && 3 < uVar23)) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_1c0) = (int)sVar6;
        }
        if (((uVar27 | 5) < uVar32) && ((long)(uVar23 - 5) < (long)uVar41 && 4 < uVar23)) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_1b0) = (int)sVar78;
        }
        if (((uVar27 | 6) < uVar32) && ((long)(uVar23 - 6) < (long)uVar41 && 5 < uVar23)) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_1a8) = (int)sVar76;
        }
        if (6 < uVar23 && (uVar27 | 7) < uVar32) {
          *(int *)((long)piVar2 + uVar23 * 4 + local_190) = (int)sVar31;
        }
        auVar60._0_2_ = -(ushort)(auVar58._0_2_ < (short)local_48._0_2_);
        auVar60._2_2_ = -(ushort)(auVar58._2_2_ < (short)local_48._2_2_);
        auVar60._4_2_ = -(ushort)(auVar58._4_2_ < (short)local_48._4_2_);
        auVar60._6_2_ = -(ushort)(auVar58._6_2_ < (short)local_48._6_2_);
        auVar60._8_2_ = -(ushort)(auVar58._8_2_ < (short)local_48._8_2_);
        auVar60._10_2_ = -(ushort)(auVar58._10_2_ < (short)local_48._10_2_);
        auVar60._12_2_ = -(ushort)(auVar58._12_2_ < (short)local_48._12_2_);
        auVar60._14_2_ = -(ushort)(auVar58._14_2_ < (short)local_48._14_2_);
        auVar50._0_2_ = -(ushort)(sVar43 < (short)local_68._0_2_);
        auVar50._2_2_ = -(ushort)(sVar51 < (short)local_68._2_2_);
        auVar50._4_2_ = -(ushort)(sVar52 < (short)local_68._4_2_);
        auVar50._6_2_ = -(ushort)(sVar53 < (short)local_68._6_2_);
        auVar50._8_2_ = -(ushort)(sVar54 < (short)local_68._8_2_);
        auVar50._10_2_ = -(ushort)(sVar55 < (short)local_68._10_2_);
        auVar50._12_2_ = -(ushort)(sVar56 < (short)local_68._12_2_);
        auVar50._14_2_ = -(ushort)(sVar57 < (short)local_68._14_2_);
        auVar63 = psraw(in_XMM15,0xf);
        auVar64._0_2_ = -(ushort)(local_128._0_2_ < sVar31);
        auVar64._2_2_ = -(ushort)(local_128._2_2_ < sVar76);
        auVar64._4_2_ = -(ushort)(local_128._4_2_ < sVar78);
        auVar64._6_2_ = -(ushort)(local_128._6_2_ < sVar6);
        auVar64._8_2_ = -(ushort)(local_128._8_2_ < sVar7);
        auVar64._10_2_ = -(ushort)(local_128._10_2_ < sVar9);
        auVar64._12_2_ = -(ushort)(local_128._12_2_ < sVar11);
        auVar64._14_2_ = -(ushort)(local_128._14_2_ < sVar13);
        auVar64 = ~auVar63 & auVar50 & auVar84 & auVar64;
        local_128 = pblendvb(local_128,auVar67,auVar64);
        auVar68._0_2_ = -(ushort)(local_58._0_2_ == sVar43);
        auVar68._2_2_ = -(ushort)(local_58._2_2_ == sVar51);
        auVar68._4_2_ = -(ushort)(local_58._4_2_ == sVar52);
        auVar68._6_2_ = -(ushort)(local_58._6_2_ == sVar53);
        auVar68._8_2_ = -(ushort)(local_58._8_2_ == sVar54);
        auVar68._10_2_ = -(ushort)(local_58._10_2_ == sVar55);
        auVar68._12_2_ = -(ushort)(local_58._12_2_ == sVar56);
        auVar68._14_2_ = -(ushort)(local_58._14_2_ == sVar57);
        auVar61._0_2_ = -(ushort)(local_138._0_2_ < sVar31);
        auVar61._2_2_ = -(ushort)(local_138._2_2_ < sVar76);
        auVar61._4_2_ = -(ushort)(local_138._4_2_ < sVar78);
        auVar61._6_2_ = -(ushort)(local_138._6_2_ < sVar6);
        auVar61._8_2_ = -(ushort)(local_138._8_2_ < sVar7);
        auVar61._10_2_ = -(ushort)(local_138._10_2_ < sVar9);
        auVar61._12_2_ = -(ushort)(local_138._12_2_ < sVar11);
        auVar61._14_2_ = -(ushort)(local_138._14_2_ < sVar13);
        auVar61 = auVar60 & auVar68 & auVar61;
        local_138 = pblendvb(local_138,auVar82,auVar61);
        local_b8 = pblendvb(local_b8,auVar82,auVar68 & auVar84);
        local_148 = pblendvb(local_148,auVar58,auVar61);
        local_c8 = pblendvb(local_c8,in_XMM15,auVar64);
        ptr_00[uVar23] = sVar31;
        ptr_01[uVar23] = auVar59._0_2_;
        in_XMM15 = paddsw(in_XMM15,_DAT_00904d10);
        uVar23 = uVar23 + 1;
        auVar63 = auVar83;
      } while (local_100 != uVar23);
      auVar58 = paddsw(auVar58,_DAT_00904d20);
      auVar15._4_4_ = uStack_d4;
      auVar15._0_4_ = local_d8;
      auVar15._8_4_ = uStack_d0;
      auVar15._12_4_ = uStack_cc;
      local_188 = psubsw(local_188,auVar15);
      local_190 = local_190 + local_118;
      local_1a0 = local_1a0 + local_118;
      local_198 = local_198 + local_118;
      local_1a8 = local_1a8 + local_118;
      local_1b0 = local_1b0 + local_118;
      local_1c0 = local_1c0 + local_118;
      local_1c8 = local_1c8 + local_118;
      local_1b8 = local_1b8 + local_118;
      uVar27 = local_108;
    } while (local_108 < uVar32);
    local_a8 = auVar47;
  }
  lVar22 = 0;
  iVar30 = 0;
  iVar19 = 0;
  iVar24 = 0;
  uVar42 = uVar34;
  uVar25 = uVar34;
  do {
    uVar1 = *(ushort *)(local_138 + lVar22 * 2);
    if ((short)(ushort)uVar42 < (short)uVar1) {
      iVar36 = (int)*(short *)(local_148 + lVar22 * 2);
      iVar30 = (int)*(short *)(local_148 + lVar22 * 2);
      uVar42 = (uint)uVar1;
    }
    else {
      iVar36 = iVar24;
      if (uVar1 == (ushort)uVar42) {
        iVar38 = (int)*(short *)(local_148 + lVar22 * 2);
        iVar36 = iVar30;
        if (iVar38 <= iVar24) {
          iVar36 = iVar38;
        }
        iVar30 = iVar36;
        if (iVar38 < iVar24) {
          uVar42 = (uint)uVar1;
        }
      }
    }
    sVar18 = (short)uVar42;
    if ((short)uVar25 < (short)*(ushort *)(local_128 + lVar22 * 2)) {
      iVar19 = (int)*(short *)(local_c8 + lVar22 * 2);
      uVar25 = (uint)*(ushort *)(local_128 + lVar22 * 2);
    }
    sVar31 = (short)uVar25;
    uVar29 = (uint)*(ushort *)(local_b8 + lVar22 * 2);
    if ((short)*(ushort *)(local_b8 + lVar22 * 2) <= (short)uVar34) {
      uVar29 = uVar34;
    }
    uVar34 = uVar29;
    lVar22 = lVar22 + 1;
    iVar24 = iVar36;
  } while ((int)lVar22 != 8);
  iVar24 = iVar19;
  sVar76 = sVar31;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_006bec8d;
    iVar24 = s2Len + -1;
    sVar76 = (short)uVar34;
    if (s2_end != 0) {
      iVar24 = iVar19;
      sVar76 = sVar31;
    }
  }
  else {
    if (sVar31 < sVar18) {
LAB_006bec8d:
      iVar30 = s2Len + -1;
      goto LAB_006becd6;
    }
    if ((sVar18 == sVar31) && (iVar30 = s2Len + -1, iVar19 == iVar30)) goto LAB_006becd6;
  }
  sVar18 = sVar76;
  iVar30 = iVar24;
  iVar36 = _s1Len - 1;
LAB_006becd6:
  auVar47._0_2_ = -(ushort)((short)local_168 < local_1e8);
  auVar47._2_2_ = -(ushort)(local_168._2_2_ < sStack_1e6);
  auVar47._4_2_ = -(ushort)(local_168._4_2_ < local_1e8);
  auVar47._6_2_ = -(ushort)(local_168._6_2_ < sStack_1e6);
  auVar47._8_2_ = -(ushort)((short)uStack_160 < local_1e8);
  auVar47._10_2_ = -(ushort)(uStack_160._2_2_ < sStack_1e6);
  auVar47._12_2_ = -(ushort)(uStack_160._4_2_ < local_1e8);
  auVar47._14_2_ = -(ushort)(uStack_160._6_2_ < sStack_1e6);
  auVar62._0_2_ = -(ushort)(local_178 < local_158._0_2_);
  auVar62._2_2_ = -(ushort)(sStack_176 < local_158._2_2_);
  auVar62._4_2_ = -(ushort)(local_178 < local_158._4_2_);
  auVar62._6_2_ = -(ushort)(sStack_176 < local_158._6_2_);
  auVar62._8_2_ = -(ushort)(local_178 < local_158._8_2_);
  auVar62._10_2_ = -(ushort)(sStack_176 < local_158._10_2_);
  auVar62._12_2_ = -(ushort)(local_178 < local_158._12_2_);
  auVar62._14_2_ = -(ushort)(sStack_176 < local_158._14_2_);
  auVar62 = auVar62 | auVar47;
  if ((((((((((((((((auVar62 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar62 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar62 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar62 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar62 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar62 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar62 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar62 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar62 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar62 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar62[0xf] < '\0') {
    *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
    sVar18 = 0;
    iVar30 = 0;
    iVar36 = 0;
  }
  ppVar21->score = (int)sVar18;
  ppVar21->end_query = iVar36;
  ppVar21->end_ref = iVar30;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar21;
  }
  return ppVar21;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}